

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qzip.cpp
# Opt level: O2

void __thiscall QZipWriter::addDirectory(QZipWriter *this,QString *dirName)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::fromNativeSeparators((QString *)&local_38,dirName);
  bVar1 = QString::endsWith((QString *)&local_38,(QChar)0x2f,CaseSensitive);
  if (!bVar1) {
    QString::append((QString *)&local_38,(QChar)0x2f);
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (char *)0x0;
  local_58.size = 0;
  QZipWriterPrivate::addEntry(this->d,Directory,(QString *)&local_38,(QByteArray *)&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QZipWriter::addDirectory(const QString &dirName)
{
    QString name(QDir::fromNativeSeparators(dirName));
    // separator is mandatory
    if (!name.endsWith(u'/'))
        name.append(u'/');
    d->addEntry(QZipWriterPrivate::Directory, name, QByteArray());
}